

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O0

void __thiscall
ChaCha20Aligned::Crypt
          (ChaCha20Aligned *this,Span<const_std::byte> in_bytes,Span<std::byte> out_bytes)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  long in_RDI;
  long in_FS_OFFSET;
  uint32_t j15;
  uint32_t j14;
  uint32_t j13;
  uint32_t j12;
  uint32_t j11;
  uint32_t j10;
  uint32_t j9;
  uint32_t j8;
  uint32_t j7;
  uint32_t j6;
  uint32_t j5;
  uint32_t j4;
  uint32_t x15;
  uint32_t x14;
  uint32_t x13;
  uint32_t x12;
  uint32_t x11;
  uint32_t x10;
  uint32_t x9;
  uint32_t x8;
  uint32_t x7;
  uint32_t x6;
  uint32_t x5;
  uint32_t x4;
  uint32_t x3;
  uint32_t x2;
  uint32_t x1;
  uint32_t x0;
  size_t blocks;
  uchar *c;
  uchar *m;
  int in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  uint32_t in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffef4;
  int local_b0;
  int local_ac;
  ulong local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = Span<const_std::byte>::size
                    ((Span<const_std::byte> *)
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  sVar3 = Span<std::byte>::size
                    ((Span<std::byte> *)
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (sVar2 != sVar3) {
    __assert_fail("in_bytes.size() == out_bytes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0xa3,"void ChaCha20Aligned::Crypt(Span<const std::byte>, Span<std::byte>)");
  }
  Span<const_std::byte>::data
            ((Span<const_std::byte> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
  ;
  UCharCast((byte *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  Span<std::byte>::data
            ((Span<std::byte> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  UCharCast((byte *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  sVar2 = Span<std::byte>::size
                    ((Span<std::byte> *)
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_48 = sVar2 >> 6;
  sVar2 = Span<std::byte>::size
                    ((Span<std::byte> *)
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (local_48 << 6 != sVar2) {
    __assert_fail("blocks * BLOCKLEN == out_bytes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0xa7,"void ChaCha20Aligned::Crypt(Span<const std::byte>, Span<std::byte>)");
  }
  if (local_48 != 0) {
    local_ac = *(int *)(in_RDI + 0x20);
    local_b0 = *(int *)(in_RDI + 0x24);
    while( true ) {
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      std::rotl<unsigned_int>(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      in_stack_fffffffffffffef4 =
           ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      in_stack_fffffffffffffef0 =
           ReadLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      local_ac = local_ac + 1;
      if (local_ac == 0) {
        local_b0 = local_b0 + 1;
      }
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      WriteLE32((uchar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffeec);
      if (local_48 == 1) break;
      local_48 = local_48 - 1;
    }
    *(int *)(in_RDI + 0x20) = local_ac;
    *(int *)(in_RDI + 0x24) = local_b0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void ChaCha20Aligned::Crypt(Span<const std::byte> in_bytes, Span<std::byte> out_bytes) noexcept
{
    assert(in_bytes.size() == out_bytes.size());
    const unsigned char* m = UCharCast(in_bytes.data());
    unsigned char* c = UCharCast(out_bytes.data());
    size_t blocks = out_bytes.size() / BLOCKLEN;
    assert(blocks * BLOCKLEN == out_bytes.size());

    uint32_t x0, x1, x2, x3, x4, x5, x6, x7, x8, x9, x10, x11, x12, x13, x14, x15;
    uint32_t j4, j5, j6, j7, j8, j9, j10, j11, j12, j13, j14, j15;

    if (!blocks) return;

    j4 = input[0];
    j5 = input[1];
    j6 = input[2];
    j7 = input[3];
    j8 = input[4];
    j9 = input[5];
    j10 = input[6];
    j11 = input[7];
    j12 = input[8];
    j13 = input[9];
    j14 = input[10];
    j15 = input[11];

    for (;;) {
        x0 = 0x61707865;
        x1 = 0x3320646e;
        x2 = 0x79622d32;
        x3 = 0x6b206574;
        x4 = j4;
        x5 = j5;
        x6 = j6;
        x7 = j7;
        x8 = j8;
        x9 = j9;
        x10 = j10;
        x11 = j11;
        x12 = j12;
        x13 = j13;
        x14 = j14;
        x15 = j15;

        // The 20 inner ChaCha20 rounds are unrolled here for performance.
        REPEAT10(
            QUARTERROUND( x0, x4, x8,x12);
            QUARTERROUND( x1, x5, x9,x13);
            QUARTERROUND( x2, x6,x10,x14);
            QUARTERROUND( x3, x7,x11,x15);
            QUARTERROUND( x0, x5,x10,x15);
            QUARTERROUND( x1, x6,x11,x12);
            QUARTERROUND( x2, x7, x8,x13);
            QUARTERROUND( x3, x4, x9,x14);
        );

        x0 += 0x61707865;
        x1 += 0x3320646e;
        x2 += 0x79622d32;
        x3 += 0x6b206574;
        x4 += j4;
        x5 += j5;
        x6 += j6;
        x7 += j7;
        x8 += j8;
        x9 += j9;
        x10 += j10;
        x11 += j11;
        x12 += j12;
        x13 += j13;
        x14 += j14;
        x15 += j15;

        x0 ^= ReadLE32(m + 0);
        x1 ^= ReadLE32(m + 4);
        x2 ^= ReadLE32(m + 8);
        x3 ^= ReadLE32(m + 12);
        x4 ^= ReadLE32(m + 16);
        x5 ^= ReadLE32(m + 20);
        x6 ^= ReadLE32(m + 24);
        x7 ^= ReadLE32(m + 28);
        x8 ^= ReadLE32(m + 32);
        x9 ^= ReadLE32(m + 36);
        x10 ^= ReadLE32(m + 40);
        x11 ^= ReadLE32(m + 44);
        x12 ^= ReadLE32(m + 48);
        x13 ^= ReadLE32(m + 52);
        x14 ^= ReadLE32(m + 56);
        x15 ^= ReadLE32(m + 60);

        ++j12;
        if (!j12) ++j13;

        WriteLE32(c + 0, x0);
        WriteLE32(c + 4, x1);
        WriteLE32(c + 8, x2);
        WriteLE32(c + 12, x3);
        WriteLE32(c + 16, x4);
        WriteLE32(c + 20, x5);
        WriteLE32(c + 24, x6);
        WriteLE32(c + 28, x7);
        WriteLE32(c + 32, x8);
        WriteLE32(c + 36, x9);
        WriteLE32(c + 40, x10);
        WriteLE32(c + 44, x11);
        WriteLE32(c + 48, x12);
        WriteLE32(c + 52, x13);
        WriteLE32(c + 56, x14);
        WriteLE32(c + 60, x15);

        if (blocks == 1) {
            input[8] = j12;
            input[9] = j13;
            return;
        }
        blocks -= 1;
        c += BLOCKLEN;
        m += BLOCKLEN;
    }
}